

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

bool cfgfile::string_trait_t::is_at_end(istream_t *stream)

{
  istream *in_RDI;
  bool bVar1;
  char_t tmp;
  char local_11;
  istream *local_10;
  
  local_11 = '\0';
  local_10 = in_RDI;
  std::operator>>(in_RDI,&local_11);
  bVar1 = local_11 == '\0';
  if (!bVar1) {
    std::istream::putback((char)local_10);
  }
  return bVar1;
}

Assistant:

static inline bool is_at_end( istream_t & stream )
	{
		char_t tmp = 0;

		stream >> tmp;

		if( tmp )
		{
			stream.putback( tmp );

			return false;
		}
		else
			return true;
	}